

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int omp_get_partition_num_places_(void)

{
  int iVar1;
  int iVar2;
  kmp_info_t *thread;
  int last_place;
  int first_place;
  int num_places;
  int gtid;
  int local_c;
  int local_4;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = __kmp_get_global_thread_id_reg();
    iVar2 = (__kmp_threads[iVar1]->th).th_first_place;
    iVar1 = (__kmp_threads[iVar1]->th).th_last_place;
    if ((iVar2 < 0) || (iVar1 < 0)) {
      local_4 = 0;
    }
    else {
      if (iVar1 < iVar2) {
        iVar2 = __kmp_affinity_num_masks - iVar2;
      }
      else {
        iVar2 = -iVar2;
      }
      local_c = iVar1 + iVar2 + 1;
      local_4 = local_c;
    }
  }
  return local_4;
}

Assistant:

int FTN_STDCALL FTN_GET_PARTITION_NUM_PLACES(void) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  int gtid, num_places, first_place, last_place;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return 0;
  if (first_place <= last_place)
    num_places = last_place - first_place + 1;
  else
    num_places = __kmp_affinity_num_masks - first_place + last_place + 1;
  return num_places;
#endif
}